

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseOrigin(LEFReader *this)

{
  token_t tVar1;
  double dVar2;
  double dVar3;
  invalid_argument *ia;
  double ynumd;
  double xnumd;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  undefined4 local_90;
  allocator<char> local_89;
  string local_88;
  undefined1 local_58 [8];
  string ynum;
  string xnum;
  LEFReader *this_local;
  
  std::__cxx11::string::string((string *)(ynum.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  tVar1 = tokenize(this,(string *)(ynum.field_2._M_local_buf + 8));
  this->m_curtok = tVar1;
  if (this->m_curtok == TOK_NUMBER) {
    tVar1 = tokenize(this,(string *)local_58);
    this->m_curtok = tVar1;
    if (this->m_curtok == TOK_NUMBER) {
      tVar1 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar1;
      if (this->m_curtok == TOK_SEMICOL) {
        dVar2 = std::__cxx11::stod((string *)((long)&ynum.field_2 + 8),(size_t *)0x0);
        dVar3 = std::__cxx11::stod((string *)local_58,(size_t *)0x0);
        (*this->_vptr_LEFReader[4])(dVar2,dVar3);
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"Expected a semicolon\n",
                   (allocator<char> *)((long)&xnumd + 7));
        error(this,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&xnumd + 7));
        this_local._7_1_ = false;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Expected a number\n",&local_b1);
      error(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Expected a number\n",&local_89);
    error(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    this_local._7_1_ = false;
  }
  local_90 = 1;
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(ynum.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parseOrigin()
{
    // ORIGIN <number> <number> ; 

    
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(xnum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(ynum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    double xnumd, ynumd;
    try
    {
        xnumd = std::stod(xnum);
        ynumd = std::stod(ynum);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onOrigin(xnumd, ynumd);

    //std::cout << "  ORIGIN " << xnum << " " << ynum << "\n";

    return true;
}